

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O1

bool __thiscall C3DFile::load(C3DFile *this,char *filename)

{
  size_t sVar1;
  bool bVar2;
  ifstream c3dstream;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,filename,_S_bin);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_220,(long)this);
    if ((this->header).c3d_id == 'P') {
      readParameterSection(this,(ifstream *)local_220);
      fillPointLabelMap(this);
      readPointSection(this,(ifstream *)local_220);
      bVar2 = true;
      std::ifstream::close();
      goto LAB_001072f6;
    }
    sVar1 = 0x11;
    filename = "Invalid C3D file!";
LAB_001072b6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open file ",0x14);
    if (filename != (char *)0x0) {
      sVar1 = strlen(filename);
      goto LAB_001072b6;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101b8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  bVar2 = false;
LAB_001072f6:
  std::ifstream::~ifstream(local_220);
  return bVar2;
}

Assistant:

bool C3DFile::load (const char* filename) {
	ifstream c3dstream (filename, ios::binary);
	if (!c3dstream) {
		cerr << "Could not open file " << filename << endl;
		return false;
	}

	// header section
	c3dstream.read(reinterpret_cast<char *>(&header), sizeof(C3DHeader));
	if (header.c3d_id != 0x50) {
		cerr << "Invalid C3D file!" << endl;
		return false;
	}

	// parameter Section
	readParameterSection (c3dstream);  

	// we read out all the indices of the labels for easier future reference
	fillPointLabelMap();

	// 3d point data section (we currently ignore the analog part)
	readPointSection(c3dstream);

	c3dstream.close();

	return true;
}